

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int PatchWeapon(int weapNum)

{
  byte *pbVar1;
  PClassAmmo *pPVar2;
  ulong uVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  uint statenum;
  size_t sVar7;
  ulong uVar8;
  FState *state;
  FDecalTemplate *pFVar9;
  PClassActor *cls;
  char *pcVar10;
  AActor *defaults;
  FStateDefinitions statedef;
  BYTE dummy [1416];
  FStateDefinitions local_5f8;
  AActor local_5b8;
  
  uVar3 = (ulong)(uint)weapNum;
  local_5f8.StateArray.Array = (FState *)0x0;
  local_5f8.StateArray.Most = 0;
  local_5f8.StateArray.Count = 0;
  local_5f8.StateLabels.Array = (FStateDefine *)0x0;
  local_5f8.StateLabels.Most = 0;
  local_5f8.StateLabels.Count = 0;
  local_5f8.laststate = (FState *)0x0;
  local_5f8.laststatebeforelabel = (FState *)0x0;
  local_5f8.lastlabel = -1;
  cls = (PClassActor *)0x0;
  defaults = &local_5b8;
  if (((uint)weapNum < 9) && ((uint)weapNum < WeaponNames.Count)) {
    cls = WeaponNames.Array[uVar3];
    if (cls == (PClassActor *)0x0) {
      cls = (PClassActor *)0x0;
    }
    else {
      defaults = (AActor *)(cls->super_PClass).Defaults;
      DPrintf(4,"Weapon %d\n",uVar3);
    }
  }
  if (cls == (PClassActor *)0x0) {
    Printf("Weapon %d out of range.\n",uVar3);
  }
  iVar6 = GetLine();
  if (iVar6 == 1) {
    bVar4 = false;
    do {
      pcVar10 = Line2;
      statenum = atoi(Line2);
      pcVar5 = Line1;
      sVar7 = strlen(Line1);
      if (sVar7 < 9) {
        iVar6 = strcasecmp(pcVar5,"Decal");
        if (iVar6 == 0) {
          stripwhite(pcVar10);
          pFVar9 = FDecalLib::GetDecalByName(&DecalLibrary,pcVar10);
          if (pFVar9 == (FDecalTemplate *)0x0) {
            Printf("Weapon %d: Unknown decal %s\n",uVar3,Line2);
          }
          else {
            defaults->DecalGenerator = &pFVar9->super_FDecalBase;
          }
        }
        else {
          iVar6 = strcasecmp(pcVar5,"Ammo use");
          if ((iVar6 == 0) || (iVar6 = strcasecmp(pcVar5,"Ammo per shot"), iVar6 == 0)) {
            *(uint *)&defaults[1].OldRenderPos.X = statenum;
            pbVar1 = (byte *)((long)&(defaults->flags6).Value + 3);
            *pbVar1 = *pbVar1 | 0x10;
          }
          else {
            iVar6 = strcasecmp(pcVar5,"Min ammo");
            if (iVar6 != 0) goto LAB_004865d3;
            *(uint *)&defaults[1].__Pos.Z = statenum;
          }
        }
      }
      else {
        iVar6 = strcasecmp(pcVar5 + (sVar7 - 6)," frame");
        if (iVar6 == 0) {
          state = FindState(statenum);
          if ((cls != (PClassActor *)0x0) && (!bVar4)) {
            bVar4 = true;
            FStateDefinitions::MakeStateDefines(&local_5f8,cls);
          }
          pcVar5 = Line1;
          iVar6 = strncasecmp(Line1,"Deselect",8);
          pcVar10 = "Select";
          if (iVar6 != 0) {
            iVar6 = strncasecmp(pcVar5,"Select",6);
            pcVar10 = "Deselect";
            if (iVar6 != 0) {
              iVar6 = strncasecmp(pcVar5,"Bobbing",7);
              pcVar10 = "Ready";
              if (iVar6 != 0) {
                iVar6 = strncasecmp(pcVar5,"Shooting",8);
                pcVar10 = "Fire";
                if (iVar6 != 0) {
                  iVar6 = strncasecmp(pcVar5,"Firing",6);
                  pcVar10 = "Flash";
                  if (iVar6 != 0) goto LAB_0048672c;
                }
              }
            }
          }
          FStateDefinitions::SetStateLabel(&local_5f8,pcVar10,state,'\x01');
        }
        else {
          iVar6 = strcasecmp(pcVar5,"Ammo type");
          if (iVar6 == 0) {
            uVar8 = (ulong)statenum;
            if (AmmoNames.Count <= statenum) {
              uVar8 = 5;
            }
            if (0xb < statenum) {
              uVar8 = 5;
            }
            pPVar2 = AmmoNames.Array[uVar8];
            defaults[1].sprev = (AActor **)pPVar2;
            if ((pPVar2 != (PClassAmmo *)0x0) &&
               (*(int *)&defaults[1].__Pos.Y =
                     *(int *)((pPVar2->super_PClassInventory).super_PClassActor.super_PClass.
                              Defaults + 0x4a8) * 2, *(int *)&defaults[1].OldRenderPos.X == 0)) {
              *(undefined4 *)&defaults[1].OldRenderPos.X = 1;
            }
          }
          else {
LAB_004865d3:
            Printf("Unknown key %s encountered in %s %d.\n",pcVar5,"Weapon",uVar3);
          }
        }
      }
LAB_0048672c:
      iVar6 = GetLine();
    } while (iVar6 == 1);
  }
  else {
    bVar4 = false;
  }
  if (defaults[1].sprev == (AActor **)0x0) {
    *(undefined4 *)&defaults[1].OldRenderPos.X = 0;
  }
  if (bVar4) {
    FStateDefinitions::InstallStates(&local_5f8,cls,defaults);
  }
  TArray<FState,_FState>::~TArray(&local_5f8.StateArray);
  TArray<FStateDefine,_FStateDefine>::~TArray(&local_5f8.StateLabels);
  return iVar6;
}

Assistant:

static int PatchWeapon (int weapNum)
{
	int result;
	PClassActor *type = NULL;
	BYTE dummy[sizeof(AWeapon)];
	AWeapon *info = (AWeapon *)&dummy;
	bool patchedStates = false;
	FStateDefinitions statedef;

	if (weapNum >= 0 && weapNum < 9 && (unsigned)weapNum < WeaponNames.Size())
	{
		type = WeaponNames[weapNum];
		if (type != NULL)
		{
			info = (AWeapon *)GetDefaultByType (type);
			DPrintf (DMSG_SPAMMY, "Weapon %d\n", weapNum);
		}
	}

	if (type == NULL)
	{
		Printf ("Weapon %d out of range.\n", weapNum);
	}

	while ((result = GetLine ()) == 1)
	{
		int val = atoi (Line2);

		if (strlen (Line1) >= 9)
		{
			if (stricmp (Line1 + strlen (Line1) - 6, " frame") == 0)
			{
				FState *state = FindState (val);

				if (type != NULL && !patchedStates)
				{
					statedef.MakeStateDefines(type);
					patchedStates = true;
				}

				if (strnicmp (Line1, "Deselect", 8) == 0)
					statedef.SetStateLabel("Select", state);
				else if (strnicmp (Line1, "Select", 6) == 0)
					statedef.SetStateLabel("Deselect", state);
				else if (strnicmp (Line1, "Bobbing", 7) == 0)
					statedef.SetStateLabel("Ready", state);
				else if (strnicmp (Line1, "Shooting", 8) == 0)
					statedef.SetStateLabel("Fire", state);
				else if (strnicmp (Line1, "Firing", 6) == 0)
					statedef.SetStateLabel("Flash", state);
			}
			else if (stricmp (Line1, "Ammo type") == 0)
			{
				if (val < 0 || val >= 12 || (unsigned)val >= AmmoNames.Size())
				{
					val = 5;
				}
				info->AmmoType1 = AmmoNames[val];
				if (info->AmmoType1 != NULL)
				{
					info->AmmoGive1 = ((AAmmo*)GetDefaultByType (info->AmmoType1))->Amount * 2;
					if (info->AmmoUse1 == 0)
					{
						info->AmmoUse1 = 1;
					}
				}
			}
			else
			{
				Printf (unknown_str, Line1, "Weapon", weapNum);
			}
		}
		else if (stricmp (Line1, "Decal") == 0)
		{
			stripwhite (Line2);
			const FDecalTemplate *decal = DecalLibrary.GetDecalByName (Line2);
			if (decal != NULL)
			{
				info->DecalGenerator = const_cast <FDecalTemplate *>(decal);
			}
			else
			{
				Printf ("Weapon %d: Unknown decal %s\n", weapNum, Line2);
			}
		}
		else if (stricmp (Line1, "Ammo use") == 0 || stricmp (Line1, "Ammo per shot") == 0)
		{
			info->AmmoUse1 = val;
			info->flags6 |= MF6_INTRYMOVE;	// flag the weapon for postprocessing (reuse a flag that can't be set by external means)
		}
		else if (stricmp (Line1, "Min ammo") == 0)
		{
			info->MinAmmo1 = val;
		}
		else
		{
			Printf (unknown_str, Line1, "Weapon", weapNum);
		}
	}

	if (info->AmmoType1 == NULL)
	{
		info->AmmoUse1 = 0;
	}

	if (patchedStates)
	{
		statedef.InstallStates(type, info);
	}

	return result;
}